

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderHeatmap<unsigned_char,ImPlot::TransformerLinLog>
               (TransformerLinLog transformer,ImDrawList *DrawList,uchar *values,int rows,int cols,
               double scale_min,double scale_max,char *fmt,ImPlotPoint *bounds_min,
               ImPlotPoint *bounds_max)

{
  ImPlotPlot *pIVar1;
  ImVec2 IVar2;
  ImPlotContext *pIVar3;
  ImPlotContext *pIVar4;
  ImPlotContext *pIVar5;
  uchar *puVar6;
  ImDrawList *this;
  ImU32 col;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  ImVec4 IVar20;
  ImVec2 a;
  ImVec2 b;
  ImVec4 color;
  ImVec2 local_e8;
  int local_dc;
  undefined1 local_d8 [16];
  long local_c8;
  uchar *local_c0;
  char *local_b8;
  double local_b0;
  double local_a8;
  ImDrawList *local_a0;
  ulong local_98;
  double local_90;
  undefined1 local_88 [16];
  undefined8 local_78;
  double local_68;
  ImVec2 local_60;
  ImVec4 local_58 [2];
  
  pIVar3 = GImPlot;
  dVar11 = (bounds_max->x - bounds_min->x) / (double)cols;
  dVar12 = (bounds_max->y - bounds_min->y) / (double)rows;
  dVar16 = dVar11 * 0.5;
  lVar9 = (long)transformer.YAxis;
  local_a8 = scale_max - scale_min;
  local_98 = (ulong)(uint)cols;
  local_c0 = values;
  local_b8 = fmt;
  local_b0 = scale_min;
  local_a0 = DrawList;
  local_90 = dVar11;
  if (0 < rows) {
    dVar17 = dVar12 * 0.5;
    iVar7 = 0;
    local_68 = dVar12 * 0.5;
    dVar19 = dVar11 * 0.5;
    dVar18 = 0.0;
    iVar8 = 0;
    local_d8._0_8_ = dVar17;
    do {
      puVar6 = local_c0;
      if (0 < cols) {
        dVar13 = dVar12 * dVar18 + local_68;
        dVar14 = 0.0;
        lVar10 = 0;
        local_dc = iVar8;
        do {
          pIVar4 = GImPlot;
          dVar15 = dVar14 * dVar11 + bounds_min->x + dVar19;
          dVar11 = bounds_max->y - dVar13;
          local_88._0_8_ = dVar11;
          local_78 = dVar14;
          dVar17 = log10((dVar11 - dVar17) / GImPlot->CurrentPlot->YAxis[lVar9].Range.Min);
          pIVar5 = GImPlot;
          pIVar1 = pIVar4->CurrentPlot;
          dVar11 = pIVar1->YAxis[lVar9].Range.Min;
          local_e8.y = (float)((((double)(float)(dVar17 / pIVar4->LogDenY[lVar9]) *
                                 (pIVar1->YAxis[lVar9].Range.Max - dVar11) + dVar11) - dVar11) *
                               pIVar4->My[lVar9] + (double)pIVar4->PixelRange[lVar9].Min.y);
          local_e8.x = (float)(((dVar15 - dVar16) - (pIVar1->XAxis).Range.Min) * pIVar4->Mx +
                              (double)pIVar4->PixelRange[lVar9].Min.x);
          dVar17 = log10(((double)local_88._0_8_ + (double)local_d8._0_8_) /
                         GImPlot->CurrentPlot->YAxis[lVar9].Range.Min);
          this = local_a0;
          pIVar1 = pIVar5->CurrentPlot;
          dVar11 = pIVar1->YAxis[lVar9].Range.Min;
          local_60.y = (float)((((double)(float)(dVar17 / pIVar5->LogDenY[lVar9]) *
                                 (pIVar1->YAxis[lVar9].Range.Max - dVar11) + dVar11) - dVar11) *
                               pIVar5->My[lVar9] + (double)pIVar5->PixelRange[lVar9].Min.y);
          local_60.x = (float)(((dVar15 + dVar16) - (pIVar1->XAxis).Range.Min) * pIVar5->Mx +
                              (double)pIVar5->PixelRange[lVar9].Min.x);
          IVar20 = LerpColormap((float)(((double)puVar6[lVar10 + iVar7] - local_b0) / local_a8 + 0.0
                                       ));
          local_58[0].w = IVar20.w;
          local_58[0]._0_12_ = IVar20._0_12_;
          local_58[0].w = (pIVar3->Style).FillAlpha * local_58[0].w;
          col = ImGui::GetColorU32(local_58);
          ImDrawList::AddRectFilled(this,&local_e8,&local_60,col,0.0,0xf);
          dVar14 = local_78 + 1.0;
          lVar10 = lVar10 + 1;
          dVar11 = local_90;
          dVar17 = (double)local_d8._0_8_;
        } while ((int)local_98 != (int)lVar10);
        iVar7 = iVar7 + (int)lVar10;
        iVar8 = local_dc;
      }
      dVar18 = dVar18 + 1.0;
      iVar8 = iVar8 + 1;
    } while (iVar8 != rows);
  }
  if (0 < rows && local_b8 != (char *)0x0) {
    iVar8 = 0;
    dVar19 = 0.0;
    iVar7 = 0;
    local_c8 = lVar9;
    do {
      puVar6 = local_c0;
      if (0 < cols) {
        dVar17 = 0.0;
        lVar10 = 0;
        do {
          pIVar3 = GImPlot;
          local_d8._0_8_ = dVar17 * dVar11 + bounds_min->x + dVar16;
          dVar18 = log10(((bounds_min->y + 1.0) - (dVar12 * dVar19 + dVar12 * 0.5)) /
                         GImPlot->CurrentPlot->YAxis[lVar9].Range.Min);
          pIVar1 = pIVar3->CurrentPlot;
          dVar11 = pIVar1->YAxis[lVar9].Range.Min;
          local_d8 = ZEXT416((uint)(float)(((double)local_d8._0_8_ - (pIVar1->XAxis).Range.Min) *
                                           pIVar3->Mx + (double)pIVar3->PixelRange[lVar9].Min.x));
          dVar11 = (((double)(float)(dVar18 / pIVar3->LogDenY[lVar9]) *
                     (pIVar1->YAxis[lVar9].Range.Max - dVar11) + dVar11) - dVar11) *
                   pIVar3->My[lVar9] + (double)pIVar3->PixelRange[lVar9].Min.y;
          local_78 = (double)CONCAT44((int)((ulong)dVar11 >> 0x20),(float)dVar11);
          sprintf((char *)local_58,local_b8,(ulong)puVar6[lVar10 + iVar8]);
          IVar2 = ImGui::CalcTextSize((char *)local_58,(char *)0x0,false,-1.0);
          local_88._8_4_ = extraout_XMM0_Dc;
          local_88._0_4_ = IVar2.x;
          local_88._4_4_ = IVar2.y;
          local_88._12_4_ = extraout_XMM0_Dd;
          IVar20 = LerpColormap((float)(((double)puVar6[lVar10 + iVar8] - local_b0) / local_a8 + 0.0
                                       ));
          local_e8.x = (float)local_d8._0_4_ - (float)local_88._0_4_ * 0.5;
          local_e8.y = (float)local_78 - (float)local_88._4_4_ * 0.5;
          ImDrawList::AddText(local_a0,&local_e8,
                              -(uint)(IVar20.z * 0.114 + IVar20.x * 0.299 + IVar20.y * 0.587 <= 0.5)
                              | 0xff000000,(char *)local_58,(char *)0x0);
          dVar17 = dVar17 + 1.0;
          lVar10 = lVar10 + 1;
          dVar11 = local_90;
        } while ((int)local_98 != (int)lVar10);
        iVar8 = iVar8 + (int)lVar10;
      }
      dVar19 = dVar19 + 1.0;
      iVar7 = iVar7 + 1;
    } while (iVar7 != rows);
  }
  return;
}

Assistant:

void RenderHeatmap(Transformer transformer, ImDrawList& DrawList, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max) {
    ImPlotContext& gp = *GImPlot;
    const double w = (bounds_max.x - bounds_min.x) / cols;
    const double h = (bounds_max.y - bounds_min.y) / rows;
    const ImPlotPoint half_size(w*0.5,h*0.5);
    int i = 0;
    for (int r = 0; r < rows; ++r) {
        for (int c = 0; c < cols; ++c) {
            ImPlotPoint p;
            p.x = bounds_min.x + 0.5*w + c*w;
            p.y = bounds_max.y - (0.5*h + r*h);
            ImVec2 a  = transformer(ImPlotPoint(p.x - half_size.x, p.y - half_size.y));
            ImVec2 b  = transformer(ImPlotPoint(p.x + half_size.x, p.y + half_size.y));
            double t = ImRemap((double)values[i], scale_min, scale_max, 0.0, 1.0);
            ImVec4 color = LerpColormap((float)t);
            color.w *= gp.Style.FillAlpha;
            ImU32 col = ImGui::GetColorU32(color);
            DrawList.AddRectFilled(a, b, col);
            i++;
        }
    }
    if (fmt != NULL) {
        i = 0;
        for (int r = 0; r < rows; ++r) {
            for (int c = 0; c < cols; ++c) {
                ImPlotPoint p;
                p.x = bounds_min.x + 0.5*w + c*w;
                p.y = bounds_min.y + 1 - (0.5*h + r*h);
                ImVec2 px = transformer(p);
                char buff[32];
                sprintf(buff, fmt, values[i]);
                ImVec2 size = ImGui::CalcTextSize(buff);
                double t = ImRemap((double)values[i], scale_min, scale_max, 0.0, 1.0);
                ImVec4 color = LerpColormap((float)t);
                ImU32 col = CalcTextColor(color);
                DrawList.AddText(px - size * 0.5f, col, buff);
                i++;
            }
        }
    }
}